

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O3

bool __thiscall
ON_EarthAnchorPoint::GetModelCompass(ON_EarthAnchorPoint *this,ON_Plane *model_compass)

{
  ON_3dVector *this_00;
  ON_3dVector *this_01;
  double dVar1;
  bool bVar2;
  long lVar3;
  ON_Plane *pOVar4;
  ON_Plane *pOVar5;
  byte bVar6;
  ON_3dVector local_c0;
  ON_Plane local_a8;
  
  bVar6 = 0;
  ON_Plane::ON_Plane(&local_a8);
  this_00 = &local_a8.xaxis;
  local_a8.xaxis.z = (this->m_model_east).z;
  local_a8.xaxis.x = (this->m_model_east).x;
  local_a8.xaxis.y = (this->m_model_east).y;
  local_a8.yaxis.x = (this->m_model_north).x;
  local_a8.yaxis.y = (this->m_model_north).y;
  local_a8.yaxis.z = (this->m_model_north).z;
  dVar1 = ON_3dVector::Length(this_00);
  if (ABS(dVar1 + -1.0) <= 1.490116119385e-08) {
LAB_003792ce:
    this_01 = &local_a8.yaxis;
    dVar1 = ON_3dVector::Length(this_01);
    if (1.490116119385e-08 < ABS(dVar1 + -1.0)) {
      bVar2 = ON_3dVector::Unitize(this_01);
      if (!bVar2) goto LAB_003793fd;
    }
    dVar1 = ON_3dVector::operator*(this_00,this_01);
    if (1.490116119385e-08 < ABS(dVar1)) {
      local_a8.xaxis.x = local_a8.xaxis.x - dVar1 * local_a8.yaxis.x;
      local_a8.xaxis.y = local_a8.xaxis.y - dVar1 * local_a8.yaxis.y;
      local_a8.xaxis.z = local_a8.xaxis.z - dVar1 * local_a8.yaxis.z;
      bVar2 = ON_3dVector::Unitize(this_00);
      if (!bVar2) goto LAB_003793fd;
    }
    ON_CrossProduct(&local_c0,this_00,this_01);
    local_a8.zaxis.z = local_c0.z;
    local_a8.zaxis.x = local_c0.x;
    local_a8.zaxis.y = local_c0.y;
    dVar1 = ON_3dVector::Length(&local_a8.zaxis);
    if (1.490116119385e-08 < ABS(dVar1 + -1.0)) {
      bVar2 = ON_3dVector::Unitize(&local_a8.zaxis);
      if (!bVar2) goto LAB_003793fd;
    }
    local_a8.origin.z = (this->m_model_point).z;
    local_a8.origin.x = (this->m_model_point).x;
    local_a8.origin.y = (this->m_model_point).y;
    ON_Plane::UpdateEquation(&local_a8);
    pOVar4 = &local_a8;
    pOVar5 = model_compass;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pOVar5->origin).x = (pOVar4->origin).x;
      pOVar4 = (ON_Plane *)((long)pOVar4 + ((ulong)bVar6 * -2 + 1) * 8);
      pOVar5 = (ON_Plane *)((long)pOVar5 + (ulong)bVar6 * -0x10 + 8);
    }
    bVar2 = ON_Plane::IsValid(model_compass);
  }
  else {
    bVar2 = ON_3dVector::Unitize(this_00);
    if (bVar2) goto LAB_003792ce;
LAB_003793fd:
    bVar2 = false;
  }
  ON_Plane::~ON_Plane(&local_a8);
  return bVar2;
}

Assistant:

bool ON_EarthAnchorPoint::GetModelCompass(ON_Plane& model_compass) const
{
  ON_Plane mc;
  mc.xaxis = m_model_east;
  mc.yaxis = m_model_north;
  if ( fabs(mc.xaxis.Length() - 1.0) > ON_SQRT_EPSILON )
  {
    if ( !mc.xaxis.Unitize() )
      return false;
  }
  if ( fabs(mc.yaxis.Length() - 1.0) > ON_SQRT_EPSILON )
  {
    if ( !mc.yaxis.Unitize() )
      return false;
  }
  double d = mc.xaxis*mc.yaxis;
  if ( fabs(d) > ON_SQRT_EPSILON )
  {
    // assume north is correct
    mc.xaxis.x -= d*mc.yaxis.x;
    mc.xaxis.y -= d*mc.yaxis.y;
    mc.xaxis.z -= d*mc.yaxis.z;
    if( !mc.xaxis.Unitize() )
      return false;
  }
  mc.zaxis = ON_CrossProduct(mc.xaxis,mc.yaxis);
  if ( fabs(mc.zaxis.Length() - 1.0) > ON_SQRT_EPSILON )
  {
    if ( !mc.zaxis.Unitize() )
      return false;
  }
  mc.origin = m_model_point;
  mc.UpdateEquation();
  model_compass = mc;
  return model_compass.IsValid();
}